

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QRhiTexture * __thiscall
QRhi::newTexture(QRhi *this,Format format,int width,int height,int depth,int sampleCount,Flags flags
                )

{
  QRhiTexture *pQVar1;
  int in_ECX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  Int in_stack_00000008;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QSize *this_00;
  undefined1 local_14 [8];
  QFlagsStorage<QRhiTexture::Flag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = in_stack_00000008;
  if (0 < in_R8D) {
    QFlags<QRhiTexture::Flag>::operator|=((QFlags<QRhiTexture::Flag> *)&local_c,ThreeDimensional);
  }
  if ((in_ECX == 0) && (in_R8D == 0)) {
    QFlags<QRhiTexture::Flag>::operator|=((QFlags<QRhiTexture::Flag> *)&local_c,OneDimensional);
  }
  this_00 = (QSize *)*in_RDI;
  QSize::QSize(this_00,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  pQVar1 = (QRhiTexture *)
           (**(code **)((long)*this_00 + 0x50))(this_00,in_ESI,local_14,in_R8D,0,in_R9D,local_c.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRhiTexture *QRhi::newTexture(QRhiTexture::Format format,
                              int width, int height, int depth,
                              int sampleCount,
                              QRhiTexture::Flags flags)
{
    if (depth > 0)
        flags |= QRhiTexture::ThreeDimensional;

    if (height == 0 && depth == 0)
        flags |= QRhiTexture::OneDimensional;

    return d->createTexture(format, QSize(width, height), depth, 0, sampleCount, flags);
}